

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultsummary.cpp
# Opt level: O0

void __thiscall trun::ResultSummary::AddResult(ResultSummary *this,Ref *tfunc)

{
  kTestResult kVar1;
  element_type *this_00;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  Ref result;
  Ref *tfunc_local;
  ResultSummary *this_local;
  
  std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)tfunc)
  ;
  TestFunc::Result((TestFunc *)&guard);
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->lock);
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  push_back(&this->testFunctions,tfunc);
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  push_back(&this->results,(value_type *)&guard);
  this->testsExecuted = this->testsExecuted + 1;
  this_00 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&guard);
  kVar1 = TestResult::Result(this_00);
  if (kVar1 != kTestResult_Pass) {
    this->testsFailed = this->testsFailed + 1;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)&guard);
  return;
}

Assistant:

void ResultSummary::AddResult(const TestFunc::Ref tfunc) {
    auto result = tfunc->Result();

#ifdef TRUN_HAVE_THREADS
    std::lock_guard<std::mutex> guard(lock);
#endif

    testFunctions.push_back(tfunc);
    results.push_back(result);

    testsExecuted++;
    if (result->Result() != kTestResult_Pass) {
        testsFailed++;
    }
}